

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Status_set_cancelled(MPIABI_Status *status,int flag)

{
  int iVar1;
  MPI_Status *mpi_status_ptr;
  
  iVar1 = MPI_Status_set_cancelled();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (int)*(undefined8 *)&status->mpi_status;
    status->MPI_TAG = (int)((ulong)*(undefined8 *)&status->mpi_status >> 0x20);
    status->MPI_ERROR = (status->mpi_status).status_OpenMPI.f2;
  }
  return iVar1;
}

Assistant:

int MPIABI_Status_set_cancelled(
  MPIABI_Status * status,
  int flag
) {
  return MPI_Status_set_cancelled(
    (MPI_Status *)(WPI_StatusPtr)status,
    flag
  );
}